

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JxScript.cpp
# Opt level: O1

void __thiscall
Jinx::Impl::Script::CallBytecodeFunction
          (Script *this,FunctionDefinitionPtr *fnDef,OnReturn onReturn)

{
  size_t *psVar1;
  pointer pEVar2;
  element_type *peVar3;
  ulong uVar4;
  
  std::
  vector<Jinx::Impl::Script::ExecutionFrame,Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,4096ul,16ul>>
  ::emplace_back<std::shared_ptr<Jinx::Impl::FunctionDefinition>const&>
            ((vector<Jinx::Impl::Script::ExecutionFrame,Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,4096ul,16ul>>
              *)&this->m_execution,fnDef);
  pEVar2 = (this->m_execution).
           super__Vector_base<Jinx::Impl::Script::ExecutionFrame,_Jinx::StaticAllocator<Jinx::Impl::Script::ExecutionFrame,_4096UL,_16UL>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  pEVar2[-1].onReturn = onReturn;
  peVar3 = (fnDef->super___shared_ptr<Jinx::Impl::FunctionDefinition,_(__gnu_cxx::_Lock_policy)2>).
           _M_ptr;
  pEVar2[-1].reader.m_pos = peVar3->m_offset;
  uVar4 = ((long)(this->m_stack).
                 super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->m_stack).
                 super__Vector_base<Jinx::Variant,_Jinx::StaticAllocator<Jinx::Variant,_4096UL,_16UL>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x3333333333333333;
  psVar1 = &peVar3->m_parameterCount;
  if (*psVar1 <= uVar4) {
    pEVar2[-1].stackTop = uVar4 - *psVar1;
    return;
  }
  __assert_fail("m_stack.size() >= fnDef->GetParameterCount()",
                "/workspace/llm4binary/github/license_c_cmakelists/JamesBoer[P]Jinx/Source/JxScript.cpp"
                ,0x410,
                "void Jinx::Impl::Script::CallBytecodeFunction(const FunctionDefinitionPtr &, OnReturn)"
               );
}

Assistant:

inline_t void Script::CallBytecodeFunction(const FunctionDefinitionPtr & fnDef, OnReturn onReturn)
	{
		m_execution.emplace_back(fnDef);
		m_execution.back().onReturn = onReturn;
		m_execution.back().reader.Seek(fnDef->GetOffset());
		assert(m_stack.size() >= fnDef->GetParameterCount());
		m_execution.back().stackTop = m_stack.size() - fnDef->GetParameterCount();
	}